

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O1

int StateCurPlayer(pyhanabi_state_t *state)

{
  if (state == (pyhanabi_state_t *)0x0) {
    __assert_fail("state != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                  ,0x150,"int StateCurPlayer(pyhanabi_state_t *)");
  }
  if (state->state != (void *)0x0) {
    return *(int *)((long)state->state + 0x70);
  }
  __assert_fail("state->state != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                ,0x151,"int StateCurPlayer(pyhanabi_state_t *)");
}

Assistant:

int StateCurPlayer(pyhanabi_state_t* state) {
  REQUIRE(state != nullptr);
  REQUIRE(state->state != nullptr);
  return reinterpret_cast<hanabi_learning_env::HanabiState*>(state->state)
      ->CurPlayer();
}